

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_decode_85(uchar *dst,uchar *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uchar *puStack_18;
  uint tmp;
  uchar *src_local;
  uchar *dst_local;
  
  src_local = dst;
  for (puStack_18 = src; *puStack_18 != '\0'; puStack_18 = puStack_18 + 5) {
    uVar1 = nk_decode_85_byte(*puStack_18);
    uVar2 = nk_decode_85_byte(puStack_18[1]);
    uVar3 = nk_decode_85_byte(puStack_18[2]);
    uVar4 = nk_decode_85_byte(puStack_18[3]);
    uVar5 = nk_decode_85_byte(puStack_18[4]);
    iVar6 = uVar1 + (uVar2 + (uVar3 + (uVar4 + uVar5 * 0x55) * 0x55) * 0x55) * 0x55;
    *src_local = (uchar)iVar6;
    src_local[1] = (uchar)((uint)iVar6 >> 8);
    src_local[2] = (uchar)((uint)iVar6 >> 0x10);
    src_local[3] = (uchar)((uint)iVar6 >> 0x18);
    src_local = src_local + 4;
  }
  return;
}

Assistant:

NK_INTERN void
nk_decode_85(unsigned char* dst, const unsigned char* src)
{
    while (*src)
    {
        unsigned int tmp =
            nk_decode_85_byte((char)src[0]) +
            85 * (nk_decode_85_byte((char)src[1]) +
            85 * (nk_decode_85_byte((char)src[2]) +
            85 * (nk_decode_85_byte((char)src[3]) +
            85 * nk_decode_85_byte((char)src[4]))));

        /* we can't assume little-endianess. */
        dst[0] = (unsigned char)((tmp >> 0) & 0xFF);
        dst[1] = (unsigned char)((tmp >> 8) & 0xFF);
        dst[2] = (unsigned char)((tmp >> 16) & 0xFF);
        dst[3] = (unsigned char)((tmp >> 24) & 0xFF);

        src += 5;
        dst += 4;
    }
}